

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall DecPOMDPDiscrete::CreateNewRewardModel(DecPOMDPDiscrete *this)

{
  RewardModelMappingSparse *this_00;
  size_t sVar1;
  size_t sVar2;
  string local_70;
  string local_50;
  
  if ((this->_m_initialized == true) && (this->_m_p_rModel != (RewardModel *)0x0)) {
    (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
      _vptr_QTableInterface[3])();
  }
  if ((this->super_MultiAgentDecisionProcessDiscrete)._m_sparse == true) {
    this_00 = (RewardModelMappingSparse *)operator_new(200);
    sVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    sVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x70))(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMappingSparse::RewardModelMappingSparse(this_00,sVar1,sVar2,&local_50,&local_70);
  }
  else {
    this_00 = (RewardModelMappingSparse *)operator_new(0x80);
    sVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    sVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x70))(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,sVar1,sVar2,&local_50,&local_70);
  }
  this->_m_p_rModel = &this_00->super_RewardModel;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DecPOMDPDiscrete::CreateNewRewardModel()
{
    if(_m_initialized)
    delete(_m_p_rModel);

    if(GetSparse())
        _m_p_rModel = new RewardModelMappingSparse( GetNrStates(), GetNrJointActions());
    else
        _m_p_rModel = new RewardModelMapping( GetNrStates(), GetNrJointActions());
}